

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::process_quoted_string(string *str,char string_char,char literal_char)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  char in_DL;
  char in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_000001e8;
  undefined8 in_stack_ffffffffffffff98;
  char __c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffdf;
  string *in_stack_ffffffffffffffe0;
  undefined6 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  __c = (char)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if (sVar3 < 2) {
    return false;
  }
  bVar1 = is_binary_escaped_string(in_stack_ffffffffffffffa8);
  if (!bVar1) {
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if ((*pvVar4 == in_SIL) &&
       (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
       *pvVar4 == in_SIL)) {
      remove_outer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),__c,
                            0x1981c0);
      if (sVar3 != 0xffffffffffffffff) {
        remove_escaped_characters(in_stack_000001e8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_SIL,CONCAT16(in_DL,in_stack_ffffffffffffffe8)));
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      }
      return true;
    }
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if ((*pvVar4 == in_DL) ||
       (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
       *pvVar4 == '`')) {
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      iVar2 = (int)*pvVar4;
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,in_stack_ffffffffffffffa0));
      if (iVar2 == *pvVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_ffffffffffffffa0));
        remove_outer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
        return true;
      }
    }
    return false;
  }
  extract_binary_string((string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_SIL,CONCAT16(in_DL,in_stack_ffffffffffffffe8)));
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return true;
}

Assistant:

CLI11_INLINE bool process_quoted_string(std::string &str, char string_char, char literal_char) {
    if(str.size() <= 1) {
        return false;
    }
    if(detail::is_binary_escaped_string(str)) {
        str = detail::extract_binary_string(str);
        return true;
    }
    if(str.front() == string_char && str.back() == string_char) {
        detail::remove_outer(str, string_char);
        if(str.find_first_of('\\') != std::string::npos) {
            str = detail::remove_escaped_characters(str);
        }
        return true;
    }
    if((str.front() == literal_char || str.front() == '`') && str.back() == str.front()) {
        detail::remove_outer(str, str.front());
        return true;
    }
    return false;
}